

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintThreeGeneric::Increment_q(ChConstraintThreeGeneric *this,double deltal)

{
  ChVariables *pCVar1;
  ulong uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Index index;
  ulong uVar7;
  Index index_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined8 in_XMM0_Qb;
  ChVectorRef local_30;
  
  pCVar1 = (this->super_ChConstraintThree).variables_a;
  if (pCVar1->disabled == false) {
    uVar2 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)uVar2 < 0) goto LAB_007d9626;
    ChVariables::Get_qb(&local_30,pCVar1);
    if (local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != uVar2) goto LAB_007d9648;
    auVar4._8_8_ = in_XMM0_Qb;
    auVar4._0_8_ = deltal;
    uVar7 = uVar2;
    if (((local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)local_30.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7), uVar2 <= uVar7)) {
      uVar7 = uVar2;
    }
    pdVar3 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar9 = uVar2 - uVar7;
    uVar8 = uVar9 + 7;
    if (-1 < (long)uVar9) {
      uVar8 = uVar9;
    }
    if (uVar7 != 0) {
      uVar10 = 0;
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar10 * 8) =
             deltal * pdVar3[uVar10] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar10 * 8);
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    uVar8 = (uVar8 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar9) {
      auVar11 = vbroadcastsd_avx512f(auVar4);
      do {
        auVar12 = vmulpd_avx512f(auVar11,*(undefined1 (*) [64])(pdVar3 + uVar7));
        auVar12 = vaddpd_avx512f(auVar12,*(undefined1 (*) [64])
                                          (local_30.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ + uVar7 * 8));
        *(undefined1 (*) [64])
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar7 * 8) = auVar12;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar8);
    }
    if ((long)uVar8 < (long)uVar2) {
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar8 * 8) =
             deltal * pdVar3[uVar8] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  pCVar1 = (this->super_ChConstraintThree).variables_b;
  if (pCVar1->disabled == false) {
    uVar2 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)uVar2 < 0) goto LAB_007d9626;
    ChVariables::Get_qb(&local_30,pCVar1);
    if (local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != uVar2) goto LAB_007d9648;
    auVar5._8_8_ = in_XMM0_Qb;
    auVar5._0_8_ = deltal;
    uVar7 = uVar2;
    if (((local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)local_30.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7), uVar2 <= uVar7)) {
      uVar7 = uVar2;
    }
    pdVar3 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar9 = uVar2 - uVar7;
    uVar8 = uVar9 + 7;
    if (-1 < (long)uVar9) {
      uVar8 = uVar9;
    }
    if (uVar7 != 0) {
      uVar10 = 0;
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar10 * 8) =
             deltal * pdVar3[uVar10] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar10 * 8);
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    uVar8 = (uVar8 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar9) {
      auVar11 = vbroadcastsd_avx512f(auVar5);
      do {
        auVar12 = vmulpd_avx512f(auVar11,*(undefined1 (*) [64])(pdVar3 + uVar7));
        auVar12 = vaddpd_avx512f(auVar12,*(undefined1 (*) [64])
                                          (local_30.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ + uVar7 * 8));
        *(undefined1 (*) [64])
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar7 * 8) = auVar12;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar8);
    }
    if ((long)uVar8 < (long)uVar2) {
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar8 * 8) =
             deltal * pdVar3[uVar8] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  pCVar1 = (this->super_ChConstraintThree).variables_c;
  if (pCVar1->disabled == false) {
    uVar2 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((long)uVar2 < 0) {
LAB_007d9626:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    ChVariables::Get_qb(&local_30,pCVar1);
    if (local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != uVar2) {
LAB_007d9648:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    auVar6._8_8_ = in_XMM0_Qb;
    auVar6._0_8_ = deltal;
    uVar7 = uVar2;
    if (((local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)local_30.
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                        ._0_8_ >> 3) & 0x1fffffff) & 7), uVar2 <= uVar7)) {
      uVar7 = uVar2;
    }
    pdVar3 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar9 = uVar2 - uVar7;
    uVar8 = uVar9 + 7;
    if (-1 < (long)uVar9) {
      uVar8 = uVar9;
    }
    if (uVar7 != 0) {
      uVar10 = 0;
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar10 * 8) =
             deltal * pdVar3[uVar10] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar10 * 8);
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    uVar8 = (uVar8 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar9) {
      auVar11 = vbroadcastsd_avx512f(auVar6);
      do {
        auVar12 = vmulpd_avx512f(auVar11,*(undefined1 (*) [64])(pdVar3 + uVar7));
        auVar12 = vaddpd_avx512f(auVar12,*(undefined1 (*) [64])
                                          (local_30.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ + uVar7 * 8));
        *(undefined1 (*) [64])
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar7 * 8) = auVar12;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar8);
    }
    if ((long)uVar8 < (long)uVar2) {
      do {
        *(double *)
         (local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar8 * 8) =
             deltal * pdVar3[uVar8] +
             *(double *)
              (local_30.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::Increment_q(const double deltal) {
    if (variables_a->IsActive()) {
        variables_a->Get_qb() += Eq_a * deltal;
    }

    if (variables_b->IsActive()) {
        variables_b->Get_qb() += Eq_b * deltal;
    }

    if (variables_c->IsActive()) {
        variables_c->Get_qb() += Eq_c * deltal;
    }
}